

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::SPxBasisBase<double>::multWithBase
          (SPxBasisBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *result)

{
  int iVar1;
  pointer pdVar2;
  SVectorBase<double> **ppSVar3;
  int *piVar4;
  pointer pdVar5;
  SVectorBase<double> *pSVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  Nonzero<double> *pNVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  SSVectorBase<double>::clear(result);
  pdVar2 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (uint)((ulong)((long)(x->super_VectorBase<double>).val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  if (0 < (int)uVar7) {
    ppSVar3 = (this->matrix).data;
    piVar4 = (result->super_IdxSet).idx;
    pdVar5 = (result->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar8 = 0;
    do {
      pSVar6 = ppSVar3[uVar8];
      iVar1 = pSVar6->memused;
      if (iVar1 < 1) {
        dVar12 = 0.0;
      }
      else {
        pNVar10 = pSVar6->m_elem;
        uVar9 = iVar1 + 1;
        dVar13 = 0.0;
        dVar11 = 0.0;
        do {
          dVar14 = pNVar10->val * pdVar2[pNVar10->idx];
          dVar12 = dVar11 + dVar14;
          dVar13 = dVar13 + (dVar14 - (dVar12 - dVar11)) + (dVar11 - (dVar12 - (dVar12 - dVar11)));
          pNVar10 = pNVar10 + 1;
          uVar9 = uVar9 - 1;
          dVar11 = dVar12;
        } while (1 < uVar9);
        dVar12 = dVar12 + dVar13;
      }
      iVar1 = (result->super_IdxSet).num;
      (result->super_IdxSet).num = iVar1 + 1;
      piVar4[iVar1] = (int)uVar8;
      pdVar5[uVar8] = dVar12;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar7 & 0x7fffffff));
  }
  return;
}

Assistant:

void SPxBasisBase<R>::multWithBase(SSVectorBase<R>& x, SSVectorBase<R>& result) const
{
   assert(status() > SINGULAR);
   assert(theLP->dim() == x.dim());
   assert(x.dim() == result.dim());

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   result.clear();

   assert(matrixIsSetup);

   for(int i = 0; i < x.dim(); ++i)
      result.add(i, (*matrix[i]) * x);

   return;
}